

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O1

void QtMWidgets::drawArrow(QPainter *p,QRect *r,QColor *color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QPainterPath path;
  undefined1 auStack_58 [8];
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  iVar1 = r->x2;
  iVar2 = r->x1;
  iVar3 = r->y2 - r->y1;
  QPainterPath::QPainterPath((QPainterPath *)auStack_58);
  local_50 = (double)r->x1;
  local_48 = (double)r->y1;
  QPainterPath::moveTo((QPointF *)auStack_58);
  local_40 = (double)(((iVar1 - iVar2) + 1) / 3);
  local_48 = (double)r->y1;
  local_50 = (double)r->x1 + local_40;
  QPainterPath::lineTo((QPointF *)auStack_58);
  local_38 = (double)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1);
  local_50 = (double)(r->x2 + 1);
  local_48 = (double)r->y1 + local_38;
  QPainterPath::lineTo((QPointF *)auStack_58);
  local_48 = (double)(r->y2 + 1);
  local_50 = (double)r->x1 + local_40;
  QPainterPath::lineTo((QPointF *)auStack_58);
  local_50 = (double)r->x1;
  local_48 = (double)(r->y2 + 1);
  QPainterPath::lineTo((QPointF *)auStack_58);
  local_50 = (double)(r->x2 + 1) - local_40;
  local_48 = local_38 + (double)r->y1;
  QPainterPath::lineTo((QPointF *)auStack_58);
  local_50 = (double)r->x1;
  local_48 = (double)r->y1;
  QPainterPath::lineTo((QPointF *)auStack_58);
  QPainter::setPen((QColor *)p);
  QBrush::QBrush((QBrush *)&local_50,color,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)&local_50);
  QPainter::drawPath((QPainterPath *)p);
  QPainterPath::~QPainterPath((QPainterPath *)auStack_58);
  return;
}

Assistant:

void drawArrow( QPainter * p, const QRect & r,
	const QColor & color )
{
	const qreal width = r.width() / 3;
	const qreal middle = r.height() / 2;

	QPainterPath path;
	path.moveTo( r.x(), r.y() );
	path.lineTo( r.x() + width, r.y() );
	path.lineTo( r.x() + r.width(), r.y() + middle );
	path.lineTo( r.x() + width, r.y() + r.height() );
	path.lineTo( r.x(), r.y() + r.height() );
	path.lineTo( r.x() + r.width() - width, r.y() + middle );
	path.lineTo( r.x(), r.y() );

	p->setPen( color );
	p->setBrush( color );
	p->drawPath( path );
}